

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::byteSwap(APInt *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar3;
  ulong extraout_RDX_02;
  uint uVar4;
  ulong *in_RSI;
  long lVar5;
  APInt AVar6;
  
  uVar4 = (uint)in_RSI[1];
  if ((uVar4 < 0x10) || ((uVar4 & 0xf) != 0)) {
    __assert_fail("BitWidth >= 16 && BitWidth % 16 == 0 && \"Cannot byteswap!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x269,"APInt llvm::APInt::byteSwap() const");
  }
  switch(uVar4 - 0x10 >> 4) {
  case 0:
    uVar1 = (ulong)(ushort)((ushort)*in_RSI << 8 | (ushort)*in_RSI >> 8);
    this->BitWidth = 0x10;
    break;
  case 1:
    uVar4 = (uint)*in_RSI;
    uVar1 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
    ;
    this->BitWidth = 0x20;
    break;
  case 2:
    uVar1 = *in_RSI;
    APInt(this,uVar4,
          ((uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
           (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
          uVar1 << 0x38) >> 0x10,false);
    uVar3 = extraout_RDX;
    goto LAB_0015e733;
  case 3:
    uVar1 = *in_RSI;
    uVar1 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    this->BitWidth = 0x40;
    break;
  default:
    lVar5 = 0;
    APInt(this,uVar4 + 0x3f & 0xffffffc0,0,false);
    uVar1 = in_RSI[1];
    uVar2 = (ulong)(uint)uVar1 + 0x3f >> 6;
    uVar3 = extraout_RDX_01;
    while (uVar2 = uVar2 - 1, uVar2 != 0xffffffffffffffff) {
      uVar3 = *(ulong *)(*in_RSI + (uVar2 & 0xffffffff) * 8);
      uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      *(ulong *)((long)(this->U).pVal + lVar5) = uVar3;
      lVar5 = lVar5 + 8;
    }
    uVar4 = this->BitWidth - (uint)uVar1;
    if (uVar4 != 0) {
      lshrInPlace(this,uVar4);
      this->BitWidth = (uint)in_RSI[1];
      uVar3 = extraout_RDX_02;
    }
    goto LAB_0015e733;
  }
  (this->U).VAL = uVar1;
  clearUnusedBits(this);
  uVar3 = extraout_RDX_00;
LAB_0015e733:
  AVar6._8_8_ = uVar3;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::byteSwap() const {
  assert(BitWidth >= 16 && BitWidth % 16 == 0 && "Cannot byteswap!");
  if (BitWidth == 16)
    return APInt(BitWidth, ByteSwap_16(uint16_t(U.VAL)));
  if (BitWidth == 32)
    return APInt(BitWidth, ByteSwap_32(unsigned(U.VAL)));
  if (BitWidth == 48) {
    unsigned Tmp1 = unsigned(U.VAL >> 16);
    Tmp1 = ByteSwap_32(Tmp1);
    uint16_t Tmp2 = uint16_t(U.VAL);
    Tmp2 = ByteSwap_16(Tmp2);
    return APInt(BitWidth, (uint64_t(Tmp2) << 32) | Tmp1);
  }
  if (BitWidth == 64)
    return APInt(BitWidth, ByteSwap_64(U.VAL));

  APInt Result(getNumWords() * APINT_BITS_PER_WORD, 0);
  for (unsigned I = 0, N = getNumWords(); I != N; ++I)
    Result.U.pVal[I] = ByteSwap_64(U.pVal[N - I - 1]);
  if (Result.BitWidth != BitWidth) {
    Result.lshrInPlace(Result.BitWidth - BitWidth);
    Result.BitWidth = BitWidth;
  }
  return Result;
}